

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O3

DEFBUF * lookid(Global *global,int c)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *ptr;
  DEFBUF *pDVar4;
  ulong uVar5;
  int iVar6;
  DEFBUF *pDVar7;
  
  uVar1 = c;
  if (c == 0x1d) {
    uVar1 = get(global);
  }
  uVar5 = 0;
  iVar3 = 0;
  do {
    uVar2 = uVar1;
    iVar6 = iVar3;
    uVar1 = global->tokenbsize;
    ptr = global->tokenbuf;
    if (uVar5 == uVar1) {
      global->tokenbsize = uVar1 * 2;
      ptr = (char *)Realloc(ptr,(ulong)(uVar1 * 2 + 1));
      if (ptr == (char *)0x0) {
        cerror(global,FATAL_OUT_OF_MEMORY);
      }
      global->tokenbuf = ptr;
    }
    ptr[uVar5] = (char)uVar2;
    uVar5 = uVar5 + 1;
    uVar1 = get(global);
    iVar3 = iVar6 + uVar2;
  } while ((byte)(type[uVar1] - 1U) < 2);
  unget(global);
  global->tokenbuf[uVar5 & 0xffffffff] = '\0';
  if (c == 0x1d) {
    pDVar4 = (DEFBUF *)0x0;
  }
  else {
    uVar1 = iVar6 + uVar2 + (int)uVar5;
    uVar2 = uVar1 + 0x3f;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    pDVar7 = global->symtab[(int)(uVar1 - (uVar2 & 0xffffffc0))];
    pDVar4 = (DEFBUF *)0x0;
    if (pDVar7 != (DEFBUF *)0x0) {
      iVar3 = 0;
      do {
        if (pDVar7->hash == (long)(int)uVar1) {
          iVar3 = strcmp(pDVar7->name,global->tokenbuf);
          if (-1 < iVar3) goto LAB_00106085;
        }
        pDVar7 = pDVar7->link;
      } while (pDVar7 != (defbuf *)0x0);
      pDVar7 = (DEFBUF *)0x0;
LAB_00106085:
      pDVar4 = (DEFBUF *)0x0;
      if (iVar3 == 0) {
        pDVar4 = pDVar7;
      }
    }
  }
  return pDVar4;
}

Assistant:

DEFBUF *lookid(struct Global *global,
	       int c)		/* First character of token	*/
{
  /*
   * Look for the next token in the symbol table. Returns token in tokenbuf.
   * If found, returns the table pointer;  Else returns NULL.
   */

  int nhash;
  DEFBUF *dp;
  int ct;
  int temp;
  int isrecurse;	/* For #define foo foo	*/
  
  nhash = 0;
  temp = 0;
  if ((isrecurse = (c == DEF_MAGIC)))   /* If recursive macro   */
    c = get(global);                    /* hack, skip DEF_MAGIC */
  ct = 0;
  do {
    if (ct == global->tokenbsize)
      global->tokenbuf = incmem(global, global->tokenbuf, 1 + (global->tokenbsize *= 2));
    global->tokenbuf[ct++] = c; 	/* Store token byte	*/
    nhash += c; 			/* Update hash value	*/
    c = get(global);
  }  while (type[c] == LET || type[c] == DIG);
  unget(global);                        /* Rescan terminator    */
  global->tokenbuf[ct] = EOS;		/* Terminate token	*/
  if (isrecurse)                        /* Recursive definition */
    return(NULL);                       /* undefined just now   */
  nhash += ct;				/* Fix hash value	*/
  dp = global->symtab[nhash % SBSIZE];  /* Starting bucket	*/
  while (dp != (DEFBUF *) NULL) {       /* Search symbol table  */
    if (dp->hash == nhash               /* Fast precheck        */
	&& (temp = strcmp(dp->name, global->tokenbuf)) >= 0)
      break;
    dp = dp->link;			/* Nope, try next one	*/
  }
  return((temp == 0) ? dp : NULL);
}